

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spawner.cpp
# Opt level: O2

void __thiscall spawner::Spawner::decodeParam(Spawner *this,tag pTag)

{
  char *pcVar1;
  ostream *poVar2;
  State SVar3;
  string local_60 [32];
  string logSeg;
  
  pcVar1 = findNextToken('%',';',&this->tokenFormat,this->mLogPoint);
  logSeg._M_dataplus._M_p = (pointer)&logSeg.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&logSeg,this->mLogPoint,pcVar1);
  std::operator<<((ostream *)&this->field_0x100300,(string *)&logSeg);
  if (*pcVar1 != '\0') {
    this->mLogPoint = pcVar1 + (this->tokenFormat)._M_string_length + 1;
  }
  if ((byte)(pTag.data + 0x5f) < 0xf) {
    SVar3 = *(State *)(&DAT_001060ac + (ulong)(byte)(pTag.data + 0x5f) * 4);
  }
  else {
    std::__cxx11::stringbuf::str();
    poVar2 = std::operator<<((ostream *)&std::cout,local_60);
    std::operator<<(poVar2,"\n");
    std::__cxx11::string::~string(local_60);
    std::__cxx11::stringstream::~stringstream((stringstream *)&this->mSs);
    SVar3 = Logpoint;
    std::__cxx11::stringstream::stringstream((stringstream *)&this->mSs);
  }
  this->mState = SVar3;
  this->mReadSz = 0;
  std::__cxx11::string::~string((string *)&logSeg);
  return;
}

Assistant:

void decodeParam(tag pTag)
    {
        auto pData = pTag.data;
        auto ntok = findNextToken('%', ';', tokenFormat, mLogPoint);
        size_t sglen = uintptr_t(ntok)-uintptr_t(mLogPoint);
        std::string logSeg(mLogPoint, sglen);

        // std::cout << "state: Tag: " << std::hex << std::setw(2) << std::setfill('0') << unsigned(pData) << "\n";
        // std::cout << "seg str:" << logSeg  << "\n";

        mSs << logSeg;
        if (*ntok) mLogPoint = ntok + tokenFormat.size() + 1;
        if      (pData == TypeTraits<unsigned char>::type_id)      mState = State::ParamU8;
        else if (pData == TypeTraits<signed char>::type_id)        mState = State::Param8;
        else if (pData == TypeTraits<unsigned short>::type_id)     mState = State::ParamU16;
        else if (pData == TypeTraits<short>::type_id)              mState = State::Param16;
        else if (pData == TypeTraits<unsigned int>::type_id)       mState = State::ParamU32;
        else if (pData == TypeTraits<int>::type_id)                mState = State::Param32;
        else if (pData == TypeTraits<unsigned long>::type_id)      mState = State::ParamU32or34;
        else if (pData == TypeTraits<long>::type_id)               mState = State::Param32or34;
        else if (pData == TypeTraits<unsigned long long>::type_id) mState = State::ParamU64;
        else if (pData == TypeTraits<long long>::type_id)          mState = State::Param64;
        else if (pData == TypeTraits<float>::type_id)              mState = State::ParamFloat;
        else if (pData == TypeTraits<double>::type_id)             mState = State::ParamDouble;
        else if (pData == TypeTraits<void*>::type_id)              mState = State::ParamVoidP;
        else if (pData == TypeTraits<BufferLog>::type_id)          mState = State::ParamBufferLogSz;
        else if (pData == TypeTraits<const char*>::type_id)        mState = State::ParamStrSz;
        else
        {
            std::cout << mSs.str() << "\n";
            // RTP TODO: Buggy in ARM gcc
            // mSs = std::stringstream();
            mSs.~basic_stringstream();
            new (&mSs) std::stringstream();
            // mSs.str("");
            mState = State::Logpoint;
        }
        mReadSz = 0;
    }